

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t read_var(archive_read *a,uint64_t *pvalue,uint64_t *pvalue_len)

{
  wchar_t wVar1;
  uint8_t *puStack_48;
  uint8_t b;
  uint8_t *p;
  size_t i;
  size_t shift;
  uint64_t result;
  uint64_t *pvalue_len_local;
  uint64_t *pvalue_local;
  archive_read *a_local;
  
  shift = 0;
  result = (uint64_t)pvalue_len;
  pvalue_len_local = pvalue;
  pvalue_local = (uint64_t *)a;
  wVar1 = read_ahead(a,8,&stack0xffffffffffffffb8);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\0';
  }
  else {
    i = 0;
    for (p = (uint8_t *)0x0; p < (uint8_t *)0x8; p = p + 1) {
      shift = (((ulong)puStack_48[(long)p] & 0x7f) << ((byte)i & 0x3f)) + shift;
      if ((puStack_48[(long)p] & 0x80) == 0) {
        if (pvalue_len_local != (uint64_t *)0x0) {
          *pvalue_len_local = shift;
        }
        if (result == 0) {
          wVar1 = consume((archive_read *)pvalue_local,(int64_t)(p + 1));
          if (wVar1 != L'\0') {
            return L'\0';
          }
        }
        else {
          *(uint8_t **)result = p + 1;
        }
        return L'\x01';
      }
      i = i + 7;
    }
    if (pvalue_len_local != (uint64_t *)0x0) {
      *pvalue_len_local = shift;
    }
    if (result == 0) {
      wVar1 = consume((archive_read *)pvalue_local,9);
      if (wVar1 != L'\0') {
        return L'\0';
      }
    }
    else {
      *(undefined8 *)result = 9;
    }
    a_local._4_4_ = L'\x01';
  }
  return a_local._4_4_;
}

Assistant:

static int read_var(struct archive_read* a, uint64_t* pvalue,
    uint64_t* pvalue_len)
{
	uint64_t result = 0;
	size_t shift, i;
	const uint8_t* p;
	uint8_t b;

	/* We will read maximum of 8 bytes. We don't have to handle the
	 * situation to read the RAR5 variable-sized value stored at the end of
	 * the file, because such situation will never happen. */
	if(!read_ahead(a, 8, &p))
		return 0;

	for(shift = 0, i = 0; i < 8; i++, shift += 7) {
		b = p[i];

		/* Strip the MSB from the input byte and add the resulting
		 * number to the `result`. */
		result += (b & (uint64_t)0x7F) << shift;

		/* MSB set to 1 means we need to continue decoding process.
		 * MSB set to 0 means we're done.
		 *
		 * This conditional checks for the second case. */
		if((b & 0x80) == 0) {
			if(pvalue) {
				*pvalue = result;
			}

			/* If the caller has passed the `pvalue_len` pointer,
			 * store the number of consumed bytes in it and do NOT
			 * consume those bytes, since the caller has all the
			 * information it needs to perform */
			if(pvalue_len) {
				*pvalue_len = 1 + i;
			} else {
				/* If the caller did not provide the
				 * `pvalue_len` pointer, it will not have the
				 * possibility to advance the file pointer,
				 * because it will not know how many bytes it
				 * needs to consume. This is why we handle
				 * such situation here automatically. */
				if(ARCHIVE_OK != consume(a, 1 + i)) {
					return 0;
				}
			}

			/* End of decoding process, return success. */
			return 1;
		}
	}

	/* The decoded value takes the maximum number of 8 bytes.
	 * It's a maximum number of bytes, so end decoding process here
	 * even if the first bit of last byte is 1. */
	if(pvalue) {
		*pvalue = result;
	}

	if(pvalue_len) {
		*pvalue_len = 9;
	} else {
		if(ARCHIVE_OK != consume(a, 9)) {
			return 0;
		}
	}

	return 1;
}